

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O0

pair<long_*,_long_*> __thiscall memt::Arena::allocArrayNoCon<long>(Arena *this,size_t elementCount)

{
  bad_alloc *this_00;
  pair<long_*,_long_*> pVar1;
  long *local_48;
  long *arrayEnd;
  long *array;
  char *buffer;
  size_t size;
  size_t elementCount_local;
  Arena *this_local;
  
  size = elementCount;
  elementCount_local = (size_t)this;
  if (0x1fffffffffffffff < elementCount) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  buffer = (char *)(elementCount << 3);
  arrayEnd = (long *)alloc(this,(size_t)buffer);
  local_48 = (long *)((long)arrayEnd + (long)buffer);
  array = arrayEnd;
  pVar1 = std::make_pair<long*&,long*&>(&arrayEnd,&local_48);
  return pVar1;
}

Assistant:

std::pair<T*, T*> Arena::allocArrayNoCon(size_t elementCount) {
    if (elementCount > static_cast<size_t>(-1) / sizeof(T))
      throw std::bad_alloc();
    const size_t size = elementCount * sizeof(T);
    MEMT_ASSERT(size / sizeof(T) == elementCount);
    char* buffer = static_cast<char*>(alloc(size));
    T* array = reinterpret_cast<T*>(buffer);
    T* arrayEnd = reinterpret_cast<T*>(buffer + size);
    return std::make_pair(array, arrayEnd);
  }